

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeotriangle.cpp
# Opt level: O0

void pzgeom::TPZGeoTriangle::VectorialProduct
               (TPZVec<double> *v1,TPZVec<double> *v2,TPZVec<double> *result)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int64_t iVar7;
  ostream *this;
  double *pdVar8;
  TPZVec<double> *in_RDX;
  TPZVec<double> *in_RSI;
  TPZVec<double> *in_RDI;
  REAL z2;
  REAL y2;
  REAL x2;
  REAL z1;
  REAL y1;
  REAL x1;
  
  iVar7 = TPZVec<double>::NElements(in_RDI);
  if (iVar7 == 3) {
    iVar7 = TPZVec<double>::NElements(in_RSI);
    if (iVar7 == 3) goto LAB_01638545;
  }
  this = std::operator<<((ostream *)&std::cout," o tamanho do vetores eh diferente de 3");
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
LAB_01638545:
  pdVar8 = TPZVec<double>::operator[](in_RDI,0);
  dVar1 = *pdVar8;
  pdVar8 = TPZVec<double>::operator[](in_RDI,1);
  dVar2 = *pdVar8;
  pdVar8 = TPZVec<double>::operator[](in_RDI,2);
  dVar3 = *pdVar8;
  pdVar8 = TPZVec<double>::operator[](in_RSI,0);
  dVar4 = *pdVar8;
  pdVar8 = TPZVec<double>::operator[](in_RSI,1);
  dVar5 = *pdVar8;
  pdVar8 = TPZVec<double>::operator[](in_RSI,2);
  dVar6 = *pdVar8;
  iVar7 = TPZVec<double>::NElements(in_RDI);
  (*in_RDX->_vptr_TPZVec[3])(in_RDX,iVar7);
  pdVar8 = TPZVec<double>::operator[](in_RDX,0);
  *pdVar8 = dVar2 * dVar6 + -(dVar3 * dVar5);
  pdVar8 = TPZVec<double>::operator[](in_RDX,1);
  *pdVar8 = dVar3 * dVar4 + -(dVar1 * dVar6);
  pdVar8 = TPZVec<double>::operator[](in_RDX,2);
  *pdVar8 = dVar1 * dVar5 + -(dVar2 * dVar4);
  return;
}

Assistant:

void TPZGeoTriangle::VectorialProduct(TPZVec<REAL> &v1, TPZVec<REAL> &v2,TPZVec<REAL> &result){
		if(v1.NElements()!=3||v2.NElements()!=3)
		{
			cout << " o tamanho do vetores eh diferente de 3"<< endl;
		}
		REAL x1=v1[0], y1=v1[1],z1=v1[2];
		REAL x2=v2[0], y2=v2[1],z2=v2[2];
		result.Resize(v1.NElements());
		result[0]=y1*z2-z1*y2;
		result[1]=z1*x2-x1*z2;	
		result[2]=x1*y2-y1*x2;	
	}